

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileContainingSymbol(DescriptorPool *this,string *symbol_name)

{
  Tables *pTVar1;
  bool bVar2;
  const_iterator cVar3;
  FileDescriptor *pFVar4;
  MutexLockMaybe lock;
  MutexLockMaybe local_38;
  Symbol local_30;
  pointer local_20;
  
  local_38.mu_ = this->mutex_;
  if (local_38.mu_ != (Mutex *)0x0) {
    internal::Mutex::Lock(local_38.mu_);
  }
  pTVar1 = (this->tables_).ptr_;
  if (pTVar1 == (Tables *)0x0) {
LAB_0057ed48:
    __assert_fail("ptr_ != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                  ,0x5f,
                  "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
                 );
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)&pTVar1->known_bad_symbols_);
  pTVar1 = (this->tables_).ptr_;
  if (pTVar1 == (Tables *)0x0) goto LAB_0057ed48;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)&pTVar1->known_bad_files_);
  pTVar1 = (this->tables_).ptr_;
  if (pTVar1 == (Tables *)0x0) goto LAB_0057ed48;
  local_20 = (symbol_name->_M_dataplus)._M_p;
  cVar3 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&pTVar1->symbols_by_name_,&local_20);
  if (cVar3.super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
      _M_cur == (__node_type *)0x0) {
    local_30.type = NULL_SYMBOL;
    local_30.field_1.descriptor = (Descriptor *)0x0;
  }
  else {
    local_30.type =
         *(Type *)((long)cVar3.
                         super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                         ._M_cur + 0x10);
    local_30.field_1 =
         *(anon_union_8_8_13f84498_for_Symbol_2 *)
          ((long)cVar3.
                 super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                 ._M_cur + 0x18);
  }
  if (local_30.type == NULL_SYMBOL) {
    if (this->underlay_ != (DescriptorPool *)0x0) {
      pFVar4 = FindFileContainingSymbol(this->underlay_,symbol_name);
      if (pFVar4 != (FileDescriptor *)0x0) goto LAB_0057ecc0;
    }
    bVar2 = TryFindSymbolInFallbackDatabase(this,symbol_name);
    if (bVar2) {
      pTVar1 = (this->tables_).ptr_;
      if (pTVar1 == (Tables *)0x0) goto LAB_0057ed48;
      local_20 = (symbol_name->_M_dataplus)._M_p;
      cVar3 = std::
              _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&pTVar1->symbols_by_name_,&local_20);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
          _M_cur == (__node_type *)0x0) {
        local_30.type = NULL_SYMBOL;
        local_30.field_1.descriptor = (Descriptor *)0x0;
      }
      else {
        local_30.type =
             *(Type *)((long)cVar3.
                             super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                             ._M_cur + 0x10);
        local_30.field_1 =
             *(anon_union_8_8_13f84498_for_Symbol_2 *)
              ((long)cVar3.
                     super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                     ._M_cur + 0x18);
      }
      if (local_30.type != NULL_SYMBOL) goto LAB_0057ecb3;
    }
    pFVar4 = (FileDescriptor *)0x0;
  }
  else {
LAB_0057ecb3:
    pFVar4 = Symbol::GetFile(&local_30);
  }
LAB_0057ecc0:
  internal::MutexLockMaybe::~MutexLockMaybe(&local_38);
  return pFVar4;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileContainingSymbol(
    const string& symbol_name) const {
  MutexLockMaybe lock(mutex_);
  tables_->known_bad_symbols_.clear();
  tables_->known_bad_files_.clear();
  Symbol result = tables_->FindSymbol(symbol_name);
  if (!result.IsNull()) return result.GetFile();
  if (underlay_ != NULL) {
    const FileDescriptor* file_result =
      underlay_->FindFileContainingSymbol(symbol_name);
    if (file_result != NULL) return file_result;
  }
  if (TryFindSymbolInFallbackDatabase(symbol_name)) {
    result = tables_->FindSymbol(symbol_name);
    if (!result.IsNull()) return result.GetFile();
  }
  return NULL;
}